

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxInWitnessByHandle
              (void *handle,void *tx_data_handle,int stack_type,uint32_t txin_index,
              uint32_t stack_index,char **stack_data)

{
  undefined8 uVar1;
  CfdException *this;
  size_type sVar2;
  string *psVar3;
  reference this_00;
  char *pcVar4;
  uint32_t in_ECX;
  int in_EDX;
  string *in_RSI;
  uint in_R8D;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  ConfidentialTxInReference ref_1;
  ConfidentialTransactionContext *tx_1;
  TxInReference ref;
  TransactionContext *tx;
  bool is_bitcoin;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  CfdCapiTransactionData *tx_data;
  ConfidentialTxInReference *in_stack_fffffffffffffaf8;
  ConfidentialTxInReference *in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  CfdError error_code;
  allocator *paVar5;
  CfdException *in_stack_fffffffffffffb20;
  bool *in_stack_fffffffffffffb58;
  string local_480;
  undefined1 local_45a;
  allocator local_459;
  string local_458 [32];
  CfdSourceLocation local_438;
  undefined1 local_41a;
  allocator local_419;
  string local_418 [32];
  string *in_stack_fffffffffffffc08;
  int in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  ScriptWitness local_3e0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_3c0;
  ScriptWitness local_3a8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_388;
  ConfidentialTxInReference local_370;
  ConfidentialTransaction *local_210;
  ScriptWitness local_208;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1e8;
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8 [32];
  CfdSourceLocation local_1a8;
  TxInReference local_190;
  Transaction *local_100;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [39];
  byte local_c9;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_c8;
  string *local_b0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  allocator local_61;
  string local_60 [48];
  undefined8 *local_30;
  uint local_24;
  uint32_t local_20;
  int local_1c;
  string *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  psVar3 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"TransactionData",&local_61);
  cfd::capi::CheckBuffer
            ((void *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc08);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (local_30 == (undefined8 *)0x0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0xe9a;
    local_80.funcname = "CfdGetTxInWitnessByHandle";
    cfd::core::logger::warn<>(&local_80,"stack data is null.");
    local_a2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    paVar5 = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. stack data is null.",paVar5);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb20,error_code,in_stack_fffffffffffffb10);
    local_a2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_b0 = local_18;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector(&local_c8);
  local_c9 = 0;
  cfd::capi::ConvertNetType((int)((ulong)psVar3 >> 0x20),in_stack_fffffffffffffb58);
  if (*(long *)((long)&local_b0->field_2 + 8) == 0) {
    local_f2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Invalid handle state. tx is null",&local_f1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb20,error_code,in_stack_fffffffffffffb10);
    local_f2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_c9 & 1) == 0) {
    local_210 = *(ConfidentialTransaction **)((long)&local_b0->field_2 + 8);
    cfd::core::ConfidentialTransaction::GetTxIn(&local_370,local_210,local_20);
    if (local_1c == 0) {
      cfd::core::AbstractTxInReference::GetScriptWitness
                (&in_stack_fffffffffffffaf8->super_AbstractTxInReference);
      cfd::core::ScriptWitness::GetWitness(&local_388,&local_3a8);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_c8,&local_388);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 in_stack_fffffffffffffb10);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x62af30);
    }
    else {
      if (local_1c != 1) {
        strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                ,0x2f);
        cfd::core::logger::warn<int&>
                  ((CfdSourceLocation *)&stack0xfffffffffffffc08,"Invalid stack type[{}]",&local_1c)
        ;
        local_41a = 1;
        this = (CfdException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_418,"Invalid stack type.",&local_419);
        cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffb10);
        local_41a = 0;
        __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
      }
      cfd::core::ConfidentialTxInReference::GetPeginWitness(in_stack_fffffffffffffaf8);
      cfd::core::ScriptWitness::GetWitness(&local_3c0,&local_3e0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_c8,&local_3c0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 in_stack_fffffffffffffb10);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x62b004);
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffb00);
  }
  else {
    local_100 = *(Transaction **)((long)&local_b0->field_2 + 8);
    cfd::core::Transaction::GetTxIn(&local_190,local_100,local_20);
    if (local_1c != 0) {
      local_1a8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_1a8.filename = local_1a8.filename + 1;
      local_1a8.line = 0xead;
      local_1a8.funcname = "CfdGetTxInWitnessByHandle";
      cfd::core::logger::warn<int&>(&local_1a8,"Invalid stack type[{}]",&local_1c);
      local_1ca = 1;
      uVar1 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"Invalid stack type.",&local_1c9);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffb20,error_code,in_stack_fffffffffffffb10);
      local_1ca = 0;
      __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::AbstractTxInReference::GetScriptWitness
              (&in_stack_fffffffffffffaf8->super_AbstractTxInReference);
    cfd::core::ScriptWitness::GetWitness(&local_1e8,&local_208);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&local_c8,&local_1e8);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_fffffffffffffb10);
    cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x62ae29);
    cfd::core::TxInReference::~TxInReference((TxInReference *)0x62ae36);
  }
  sVar2 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_c8);
  if (sVar2 <= local_24) {
    local_438.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_438.filename = local_438.filename + 1;
    local_438.line = 0xec7;
    local_438.funcname = "CfdGetTxInWitnessByHandle";
    cfd::core::logger::warn<>(&local_438,"stackIndex is illegal.");
    local_45a = 1;
    psVar3 = (string *)__cxa_allocate_exception(0x30);
    paVar5 = &local_459;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_458,"Failed to parameter. stackIndex out of witness stack.",paVar5);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffb20,(CfdError)((ulong)paVar5 >> 0x20),psVar3);
    local_45a = 0;
    __cxa_throw(psVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this_00 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                      (&local_c8,(ulong)local_24);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_480,this_00);
  pcVar4 = cfd::capi::CreateString(psVar3);
  *local_30 = pcVar4;
  std::__cxx11::string::~string((string *)&local_480);
  local_4 = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             in_stack_fffffffffffffb10);
  return local_4;
}

Assistant:

int CfdGetTxInWitnessByHandle(
    void* handle, void* tx_data_handle, int stack_type, uint32_t txin_index,
    uint32_t stack_index, char** stack_data) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    if (stack_data == nullptr) {
      warn(CFD_LOG_SOURCE, "stack data is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack data is null.");
    }
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    std::vector<ByteData> witness_stack;
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type != kCfdTxWitnessStackNormal) {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
      witness_stack = ref.GetScriptWitness().GetWitness();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type == kCfdTxWitnessStackNormal) {
        witness_stack = ref.GetScriptWitness().GetWitness();
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        witness_stack = ref.GetPeginWitness().GetWitness();
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (witness_stack.size() <= stack_index) {
      warn(CFD_LOG_SOURCE, "stackIndex is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. stackIndex out of witness stack.");
    }
    *stack_data = CreateString(witness_stack[stack_index].GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}